

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::SequenceRepetition::SequenceRepetition
          (SequenceRepetition *this,SequenceRepetitionSyntax *syntax,ASTContext *context)

{
  long in_RSI;
  undefined4 *in_RDI;
  SequenceRange SVar1;
  bool in_stack_00000027;
  ASTContext *in_stack_00000028;
  undefined4 local_30;
  
  *in_RDI = 0;
  SequenceRange::SequenceRange((SequenceRange *)0x94a14b);
  switch(*(int *)(in_RSI + 0x28) - 0x1bU & 0xffff) {
  case 0:
    *in_RDI = 0;
    in_RDI[1] = 0;
    break;
  default:
    *in_RDI = 0;
    break;
  case 3:
    *in_RDI = 0;
    in_RDI[1] = 1;
    return;
  case 0xb:
    *in_RDI = 2;
    break;
  case 0x19:
    *in_RDI = 1;
  }
  if (*(long *)(in_RSI + 0x38) != 0) {
    SVar1 = SequenceRange::fromSyntax((SelectorSyntax *)context,in_stack_00000028,in_stack_00000027)
    ;
    local_30 = CONCAT31(local_30._1_3_,
                        SVar1.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_engaged);
    *(long *)(in_RDI + 1) = SVar1._0_8_;
    in_RDI[3] = local_30;
  }
  return;
}

Assistant:

SequenceRepetition::SequenceRepetition(const SequenceRepetitionSyntax& syntax,
                                       const ASTContext& context) {
    switch (syntax.op.kind) {
        case TokenKind::Equals:
            kind = Nonconsecutive;
            break;
        case TokenKind::MinusArrow:
            kind = GoTo;
            break;
        case TokenKind::Plus:
            // No expressions allowed for plus.
            kind = Consecutive;
            range.min = 1;
            return;
        case TokenKind::Star:
            kind = Consecutive;
            range.min = 0;
            break;
        default:
            kind = Consecutive;
            break;
    }

    if (syntax.selector)
        range = SequenceRange::fromSyntax(*syntax.selector, context, /* allowUnbounded */ true);
}